

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

VTimeZone * icu_63::VTimeZone::createVTimeZoneByID(UnicodeString *ID)

{
  UBool UVar1;
  VTimeZone *this;
  TimeZone *pTVar2;
  size_t in_RSI;
  VTimeZone *local_50;
  int32_t local_44;
  UChar *pUStack_40;
  int32_t len;
  UChar *versionStr;
  UResourceBundle *bundle;
  UErrorCode status;
  undefined1 local_19;
  VTimeZone *local_18;
  VTimeZone *vtz;
  UnicodeString *ID_local;
  
  vtz = (VTimeZone *)ID;
  this = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,in_RSI);
  local_19 = 0;
  local_50 = (VTimeZone *)0x0;
  if (this != (VTimeZone *)0x0) {
    local_19 = 1;
    VTimeZone(this);
    local_50 = this;
  }
  local_18 = local_50;
  pTVar2 = TimeZone::createTimeZone((UnicodeString *)vtz);
  local_18->tz = (BasicTimeZone *)pTVar2;
  TimeZone::getID(&local_18->tz->super_TimeZone,&local_18->olsonzid);
  bundle._0_4_ = U_ZERO_ERROR;
  versionStr = (UChar *)0x0;
  pUStack_40 = (UChar *)0x0;
  local_44 = 0;
  versionStr = (UChar *)ures_openDirect_63((char *)0x0,"zoneinfo64",(UErrorCode *)&bundle);
  pUStack_40 = ures_getStringByKey_63
                         ((UResourceBundle *)versionStr,"TZVersion",&local_44,(UErrorCode *)&bundle)
  ;
  UVar1 = ::U_SUCCESS((UErrorCode)bundle);
  if (UVar1 != '\0') {
    UnicodeString::setTo(&local_18->icutzver,pUStack_40,local_44);
  }
  ures_close_63((UResourceBundle *)versionStr);
  return local_18;
}

Assistant:

VTimeZone*
VTimeZone::createVTimeZoneByID(const UnicodeString& ID) {
    VTimeZone *vtz = new VTimeZone();
    vtz->tz = (BasicTimeZone*)TimeZone::createTimeZone(ID);
    vtz->tz->getID(vtz->olsonzid);

    // Set ICU tzdata version
    UErrorCode status = U_ZERO_ERROR;
    UResourceBundle *bundle = NULL;
    const UChar* versionStr = NULL;
    int32_t len = 0;
    bundle = ures_openDirect(NULL, "zoneinfo64", &status);
    versionStr = ures_getStringByKey(bundle, "TZVersion", &len, &status);
    if (U_SUCCESS(status)) {
        vtz->icutzver.setTo(versionStr, len);
    }
    ures_close(bundle);
    return vtz;
}